

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_metadata.cpp
# Opt level: O0

void duckdb::ParquetMetaDataImplementation<(duckdb::ParquetMetadataOperatorType)3>
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  ParquetMetaDataOperatorData *this;
  ulong uVar1;
  MultiFileList *pMVar2;
  idx_t iVar3;
  DataChunk *in_RDX;
  ParquetMetaDataBindData *bind_data;
  ParquetMetaDataOperatorData *data;
  OpenFileInfo *in_stack_00000278;
  vector<duckdb::LogicalType,_true> *in_stack_00000280;
  ClientContext *in_stack_00000288;
  ParquetMetaDataOperatorData *in_stack_00000290;
  GlobalTableFunctionState *in_stack_ffffffffffffffe0;
  
  optional_ptr<duckdb::GlobalTableFunctionState,_true>::operator->
            ((optional_ptr<duckdb::GlobalTableFunctionState,_true> *)in_stack_ffffffffffffffe0);
  this = GlobalTableFunctionState::Cast<duckdb::ParquetMetaDataOperatorData>
                   (in_stack_ffffffffffffffe0);
  optional_ptr<const_duckdb::FunctionData,_true>::operator->
            ((optional_ptr<const_duckdb::FunctionData,_true> *)this);
  FunctionData::Cast<duckdb::ParquetMetaDataBindData>((FunctionData *)this);
  do {
    while (uVar1 = duckdb::ColumnDataCollection::Scan
                             ((ColumnDataScanState *)&this->collection,
                              (DataChunk *)&this->scan_state), (uVar1 & 1) == 0) {
      pMVar2 = shared_ptr<duckdb::MultiFileList,_true>::operator->
                         ((shared_ptr<duckdb::MultiFileList,_true> *)this);
      uVar1 = duckdb::MultiFileList::Scan
                        ((MultiFileListScanData *)pMVar2,(OpenFileInfo *)&this->file_list_scan);
      if ((uVar1 & 1) == 0) {
        return;
      }
      ParquetMetaDataOperatorData::LoadFileMetaData
                (in_stack_00000290,in_stack_00000288,in_stack_00000280,in_stack_00000278);
    }
    iVar3 = DataChunk::size(in_RDX);
  } while (iVar3 == 0);
  return;
}

Assistant:

void ParquetMetaDataImplementation(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &data = data_p.global_state->Cast<ParquetMetaDataOperatorData>();
	auto &bind_data = data_p.bind_data->Cast<ParquetMetaDataBindData>();

	while (true) {
		if (!data.collection.Scan(data.scan_state, output)) {

			// Try get next file
			if (!bind_data.file_list->Scan(data.file_list_scan, data.current_file)) {
				return;
			}

			switch (TYPE) {
			case ParquetMetadataOperatorType::SCHEMA:
				data.LoadSchemaData(context, bind_data.return_types, data.current_file);
				break;
			case ParquetMetadataOperatorType::META_DATA:
				data.LoadRowGroupMetadata(context, bind_data.return_types, data.current_file);
				break;
			case ParquetMetadataOperatorType::KEY_VALUE_META_DATA:
				data.LoadKeyValueMetaData(context, bind_data.return_types, data.current_file);
				break;
			case ParquetMetadataOperatorType::FILE_META_DATA:
				data.LoadFileMetaData(context, bind_data.return_types, data.current_file);
				break;
			case ParquetMetadataOperatorType::BLOOM_PROBE: {
				auto &bloom_probe_bind_data = data_p.bind_data->Cast<ParquetBloomProbeBindData>();
				data.ExecuteBloomProbe(context, bind_data.return_types, data.current_file,
				                       bloom_probe_bind_data.probe_column_name, bloom_probe_bind_data.probe_constant);
				break;
			}
			default:
				throw InternalException("Unsupported ParquetMetadataOperatorType");
			}
			continue;
		}
		if (output.size() != 0) {
			return;
		}
	}
}